

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

faup_feature_t faup_options_field_get_feature(faup_handler_t *fh,faup_url_field_t field)

{
  faup_feature_t fVar1;
  undefined4 local_30;
  faup_feature_t error;
  faup_url_field_t field_local;
  faup_handler_t *fh_local;
  undefined4 uStack_10;
  uint32_t local_c;
  
  if ((field & FAUP_URL_FIELD_SCHEME) == 0) {
    if ((field & FAUP_URL_FIELD_CREDENTIAL) == 0) {
      if ((field & FAUP_URL_FIELD_SUBDOMAIN) == 0) {
        if ((field & FAUP_URL_FIELD_DOMAIN) == 0) {
          if ((field & FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD) == 0) {
            if ((field & FAUP_URL_FIELD_HOST) == 0) {
              if ((field & FAUP_URL_FIELD_TLD) == 0) {
                if ((field & FAUP_URL_FIELD_PORT) == 0) {
                  if ((field & FAUP_URL_FIELD_RESOURCE_PATH) == 0) {
                    if ((field & FAUP_URL_FIELD_QUERY_STRING) == 0) {
                      if ((field & FAUP_URL_FIELD_FRAGMENT) == 0) {
                        if ((field & FAUP_URL_FIELD_URL_TYPE) == 0) {
                          unique0x10000058 = CONCAT44(0xffffffff,local_30);
                          local_c = 0xffffffff;
                        }
                        else {
                          unique0x10000050 = CONCAT44(0xffffffff,local_30);
                          local_c = 0xffffffff;
                        }
                      }
                      else {
                        fh_local._4_4_ = (fh->faup).features.fragment.field;
                        uStack_10 = (fh->faup).features.fragment.pos;
                        local_c = (fh->faup).features.fragment.size;
                      }
                    }
                    else {
                      fh_local._4_4_ = (fh->faup).features.query_string.field;
                      uStack_10 = (fh->faup).features.query_string.pos;
                      local_c = (fh->faup).features.query_string.size;
                    }
                  }
                  else {
                    fh_local._4_4_ = (fh->faup).features.resource_path.field;
                    uStack_10 = (fh->faup).features.resource_path.pos;
                    local_c = (fh->faup).features.resource_path.size;
                  }
                }
                else {
                  fh_local._4_4_ = (fh->faup).features.port.field;
                  uStack_10 = (fh->faup).features.port.pos;
                  local_c = (fh->faup).features.port.size;
                }
              }
              else {
                fh_local._4_4_ = (fh->faup).features.tld.field;
                uStack_10 = (fh->faup).features.tld.pos;
                local_c = (fh->faup).features.tld.size;
              }
            }
            else {
              fh_local._4_4_ = (fh->faup).features.host.field;
              uStack_10 = (fh->faup).features.host.pos;
              local_c = (fh->faup).features.host.size;
            }
          }
          else {
            fh_local._4_4_ = (fh->faup).features.domain_without_tld.field;
            uStack_10 = (fh->faup).features.domain_without_tld.pos;
            local_c = (fh->faup).features.domain_without_tld.size;
          }
        }
        else {
          fh_local._4_4_ = (fh->faup).features.domain.field;
          uStack_10 = (fh->faup).features.domain.pos;
          local_c = (fh->faup).features.domain.size;
        }
      }
      else {
        fh_local._4_4_ = (fh->faup).features.subdomain.field;
        uStack_10 = (fh->faup).features.subdomain.pos;
        local_c = (fh->faup).features.subdomain.size;
      }
    }
    else {
      fh_local._4_4_ = (fh->faup).features.credential.field;
      uStack_10 = (fh->faup).features.credential.pos;
      local_c = (fh->faup).features.credential.size;
    }
  }
  else {
    fh_local._4_4_ = (fh->faup).features.scheme.field;
    uStack_10 = (fh->faup).features.scheme.pos;
    local_c = (fh->faup).features.scheme.size;
  }
  fVar1.size = local_c;
  fVar1.field = fh_local._4_4_;
  fVar1.pos = uStack_10;
  return fVar1;
}

Assistant:

faup_feature_t faup_options_field_get_feature(faup_handler_t const *fh, faup_url_field_t field)
{
	faup_feature_t error;
	error.pos = -1;
	error.size = -1;

	if (field & FAUP_URL_FIELD_SCHEME) {
		return fh->faup.features.scheme;
	}
	if (field & FAUP_URL_FIELD_CREDENTIAL) {
		return fh->faup.features.credential;
	}
	if (field & FAUP_URL_FIELD_SUBDOMAIN) {
		return fh->faup.features.subdomain;
	}
	if (field & FAUP_URL_FIELD_DOMAIN) {
		return fh->faup.features.domain;
	}
	if (field & FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD) {
		return fh->faup.features.domain_without_tld;
	}
	if (field & FAUP_URL_FIELD_HOST) {
		return fh->faup.features.host;
	}
	if (field & FAUP_URL_FIELD_TLD) {
		return fh->faup.features.tld;
	}
	if (field & FAUP_URL_FIELD_PORT) {
		return fh->faup.features.port;
	}
	if (field & FAUP_URL_FIELD_RESOURCE_PATH) {
		return fh->faup.features.resource_path;
	}
	if (field & FAUP_URL_FIELD_QUERY_STRING) {
		return fh->faup.features.query_string;
	}
	if (field & FAUP_URL_FIELD_FRAGMENT) {
		return fh->faup.features.fragment;
	}
	if (field & FAUP_URL_FIELD_URL_TYPE) {
		return error;
	}

	return error;
}